

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O3

DFSIt<dg::vr::VRCodeGraph::SimpleVisit> * __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this)

{
  uint uVar1;
  VRLocation *pVVar2;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *pvVar3;
  pointer puVar4;
  pointer ptVar5;
  pointer ptVar6;
  pointer ptVar7;
  ulong uVar8;
  long lVar9;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *pvVar10;
  ulong uVar11;
  bool bVar12;
  VREdge *nextEdge;
  VREdge *prevEdge;
  VRLocation *current;
  VRLocation *next;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_58;
  _Head_base<2UL,_dg::vr::VREdge_*,_false> local_50;
  VRLocation *local_48;
  int local_3c;
  VRLocation *local_38;
  
  ptVar5 = (this->stack).
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar7 = (this->stack).
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar5 != ptVar7) {
    do {
      ptVar6 = ptVar7 + -1;
      pVVar2 = ptVar7[-1].
               super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
               super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
      uVar1 = ptVar7[-1].
              super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
              super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
              super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
      uVar11 = (ulong)uVar1;
      local_50._M_head_impl =
           ptVar7[-1].super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
           super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
           super__Tuple_impl<2UL,_dg::vr::VREdge_*>.super__Head_base<2UL,_dg::vr::VREdge_*,_false>.
           _M_head_impl;
      (this->stack).
      super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ptVar6;
      bVar12 = this->dir != FORWARD;
      pvVar10 = (vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)&pVVar2->successors;
      if (bVar12) {
        pvVar10 = &pVVar2->predecessors;
      }
      pvVar3 = (vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)&pVVar2->successors;
      if (bVar12) {
        pvVar3 = &pVVar2->predecessors;
      }
      uVar8 = (ulong)((long)(pvVar3->
                            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>)
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar10->
                           super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3;
      if (uVar1 < (uint)uVar8) {
        lVar9 = uVar11 * 8;
        local_48 = pVVar2;
        do {
          if (this->dir == FORWARD) {
            puVar4 = (pVVar2->successors).
                     super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11;
          }
          else {
            puVar4 = (pointer)((long)(pVVar2->predecessors).
                                     super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
          }
          bVar12 = isIrrelevant(this,(VREdge *)
                                     (puVar4->_M_t).
                                     super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>
                                     ._M_t);
          if (!bVar12) {
            local_58._M_head_impl._0_4_ = (int)uVar11 + 1;
            std::
            vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
            ::emplace_back<dg::vr::VRLocation*&,unsigned_int,dg::vr::VREdge*&>
                      ((vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
                        *)&this->stack,&local_48,(uint *)&local_58,&local_50._M_head_impl);
            if (this->dir == FORWARD) {
              puVar4 = (local_48->successors).
                       super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = 8;
            }
            else {
              puVar4 = (pointer)(local_48->predecessors).
                                super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = 0;
            }
            local_58._M_head_impl =
                 *(VREdge **)
                  &puVar4[uVar11 & 0xffffffff]._M_t.
                   super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
            local_38 = *(VRLocation **)((long)local_58._M_head_impl + lVar9);
            SimpleVisit::find(&this->super_SimpleVisit,local_38);
            local_3c = 0;
            std::
            vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
            ::emplace_back<dg::vr::VRLocation*&,int,dg::vr::VREdge*&>
                      ((vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
                        *)&this->stack,&local_38,&local_3c,(VREdge **)&local_58);
            return this;
          }
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 8;
        } while ((uVar8 & 0xffffffff) != uVar11);
        ptVar5 = (this->stack).
                 super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ptVar6 = (this->stack).
                 super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      ptVar7 = ptVar6;
    } while (ptVar5 != ptVar6);
  }
  return this;
}

Assistant:

DFSIt &operator++() {
            while (!stack.empty()) {
                VRLocation *current;
                unsigned index;
                VREdge *prevEdge;
                std::tie(current, index, prevEdge) = stack.back();
                stack.pop_back();

                unsigned nextSize = dir == Dir::FORWARD ? current->succsSize()
                                                        : current->predsSize();
                // do not explore if there is no target or if target was already
                // explored or if is in other function

                while (index < nextSize &&
                       isIrrelevant(getNextEdge(current, index)))
                    ++index;

                if (index >= nextSize)
                    continue;
                stack.emplace_back(current, index + 1, prevEdge);

                VREdge *nextEdge = getNextEdge(current, index);
                VRLocation *next = getNextLocation(nextEdge);

                Visit::find(next);
                if (Visit::shouldVisit(next)) {
                    stack.emplace_back(next, 0, nextEdge);
                    break;
                }
            }
            return *this;
        }